

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void searchtest(void)

{
  search234_state ss_00;
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  tree234 *t;
  bool bVar5;
  search234_state ss;
  char *expected [60];
  char directionbuf [600];
  search234_state local_490;
  char *local_468 [60];
  char local_288 [608];
  
  uVar2 = 0;
  iVar3 = 0;
  if (verbose != 0) {
    printf("beginning searchtest:");
    iVar3 = verbose;
  }
  t = tree;
  pcVar1 = (char *)index234(tree,0);
  if (pcVar1 != (char *)0x0) {
    uVar2 = 0;
    iVar4 = iVar3;
    do {
      local_468[uVar2] = pcVar1;
      bVar5 = iVar4 != 0;
      iVar4 = 0;
      if (bVar5) {
        printf(" %d=%s",uVar2 & 0xffffffff,pcVar1);
        t = tree;
        iVar3 = verbose;
        iVar4 = verbose;
      }
      uVar2 = uVar2 + 1;
      pcVar1 = (char *)index234(t,(int)uVar2);
    } while (pcVar1 != (char *)0x0);
  }
  if (iVar3 != 0) {
    printf(" count=%d\n");
    t = tree;
  }
  local_490._node = t->root;
  local_490._last = -1;
  local_490._base = 0;
  search234_step(&local_490,0);
  ss_00._last = local_490._last;
  ss_00._hi = local_490._hi;
  ss_00._28_4_ = local_490._28_4_;
  ss_00._base = local_490._base;
  ss_00.index = local_490.index;
  ss_00._lo = local_490._lo;
  ss_00.element = local_490.element;
  ss_00._node = local_490._node;
  searchtest_recurse(ss_00,0,(int)uVar2,local_468,local_288,local_288);
  return;
}

Assistant:

void searchtest(void)
{
    char *expected[NSTR], *p;
    char directionbuf[NSTR * 10];
    int n;
    search234_state ss;

    if (verbose)
        printf("beginning searchtest:");
    for (n = 0; (p = index234(tree, n)) != NULL; n++) {
        expected[n] = p;
        if (verbose)
            printf(" %d=%s", n, p);
    }
    if (verbose)
        printf(" count=%d\n", n);

    search234_start(&ss, tree);
    searchtest_recurse(ss, 0, n, expected, directionbuf, directionbuf);
}